

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O2

Result * __thiscall
testing::Action<std::experimental::fundamentals_v1::optional<InotifyEvent>_()>::Perform
          (Result *__return_storage_ptr__,
          Action<std::experimental::fundamentals_v1::optional<InotifyEvent>_()> *this,
          ArgumentTuple *args)

{
  ActionInterface<std::experimental::fundamentals_v1::optional<InotifyEvent>_()> *pAVar1;
  allocator local_49;
  string local_48;
  
  pAVar1 = (this->impl_).value_;
  std::__cxx11::string::string
            ((string *)&local_48,
             "You are using DoDefault() inside a composite action like DoAll() or WithArgs().  This is not supported for technical reasons.  Please instead spell out the default action, or assign the default action to an Action variable and use the variable in various places."
             ,&local_49);
  internal::Assert(pAVar1 != (ActionInterface<std::experimental::fundamentals_v1::optional<InotifyEvent>_()>
                              *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/contrib/googletest-release-1.8.0/googlemock/include/gmock/gmock-actions.h"
                   ,0x185,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  pAVar1 = (this->impl_).value_;
  (*pAVar1->_vptr_ActionInterface[2])(__return_storage_ptr__,pAVar1,args);
  return __return_storage_ptr__;
}

Assistant:

Result Perform(const ArgumentTuple& args) const {
    internal::Assert(
        !IsDoDefault(), __FILE__, __LINE__,
        "You are using DoDefault() inside a composite action like "
        "DoAll() or WithArgs().  This is not supported for technical "
        "reasons.  Please instead spell out the default action, or "
        "assign the default action to an Action variable and use "
        "the variable in various places.");
    return impl_->Perform(args);
  }